

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

CFG * wasm::analysis::CFG::fromFunction(CFG *__return_storage_ptr__,Function *func)

{
  pointer *pppBVar1;
  map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_unsigned_long,_std::less<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>_>
  *pmVar2;
  _Hash_node_base *p_Var3;
  pointer ppEVar4;
  Expression *pEVar5;
  iterator iVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  BasicBlock *pBVar9;
  pointer puVar10;
  pointer pBVar11;
  _Hash_node_base *p_Var12;
  _Hash_node_base *p_Var13;
  BasicBlock *pBVar14;
  pointer *pppEVar15;
  mapped_type *ppBVar16;
  _Hash_node_base _Var17;
  Expression **extraout_RDX;
  Expression **extraout_RDX_00;
  Expression **currp;
  ulong uVar18;
  __buckets_ptr __n;
  ulong uVar19;
  _Link_type __x;
  code *self;
  pointer pTVar20;
  size_type __n_00;
  _Hash_node_base *p_Var21;
  Expression *pEVar22;
  pointer __ptr_1;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auStack_328 [8];
  CFGBuilder builder;
  undefined1 auStack_d8 [8];
  __buckets_alloc_type __alloc;
  pointer local_c8;
  vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> local_98;
  undefined1 auStack_78 [8];
  unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
  oldToNewBlocks;
  allocator_type local_31;
  
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &builder.
        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        .branches;
  auStack_328 = (undefined1  [8])0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep =
       (Expression **)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl._0_4_ = 0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.fixed._M_elems
  [9].currp = (Expression **)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.currFunction =
       (Function *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.currModule =
       (Module *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .entry = (BasicBlock *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .exit = (BasicBlock *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .loopTops.
  super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .loopTops.
  super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar2 = &builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .debugIds;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl._0_4_ = 0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __x = (_Link_type)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       builder.
       super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
       .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  memset(&builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0,0xb2);
  puVar10 = builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar9 = builder.
           super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
           .exit;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pBVar14 = builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .exit;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar2;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar2;
  if ((BasicBlock *)
      builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .basicBlocks.
      super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .exit) {
    do {
      std::
      unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
      ::~unique_ptr((unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
                     *)pBVar14);
      pBVar14 = (BasicBlock *)
                &(pBVar14->contents).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
    } while (pBVar14 != (BasicBlock *)puVar10);
    builder.
    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    .basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar9;
  }
  std::
  _Rb_tree<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_unsigned_long>_>_>
              *)builder.
                super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,__x);
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .entry = (BasicBlock *)0x0;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = '\0';
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar2;
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar2;
  CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  ::startBasicBlock((CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                     *)auStack_328);
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.currModule =
       (Module *)
       builder.
       super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
       .loopTops.
       super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (((long)builder.
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
             flexible.
             super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)builder.
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.fixed
             ._M_elems[9].currp >> 4) +
      (long)builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
            super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep !=
      0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::walk(Expression *&) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>]"
                 );
  }
  self = CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
         ::scan;
  Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
            ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)auStack_328,
             CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             ::scan,&func->body);
  currp = extraout_RDX;
  if (((long)builder.
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
             flexible.
             super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)builder.
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.fixed
             ._M_elems[9].currp >> 4) +
      (long)builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
            super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep !=
      0) {
    do {
      if ((pointer)builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                   super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack
                   .fixed._M_elems[9].currp ==
          builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
          super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible
          .
          super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
            super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::Task, 10>::back() [T = wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::Task, N = 10]"
                       );
        }
        pTVar20 = (pointer)((long)(&builder.
                                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                    .
                                    super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                                    .
                                    super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                                    .stack.fixed + -1) + 0x88 +
                           (long)builder.
                                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                 .
                                 super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                                 .
                                 super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                                 .replacep * 0x10);
      }
      else {
        pTVar20 = builder.
                  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
                  flexible.
                  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      self = (code *)pTVar20->currp;
      if ((pointer)builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                   super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack
                   .fixed._M_elems[9].currp ==
          builder.
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
          super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible
          .
          super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
            super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,
                        "void wasm::SmallVector<wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::Task, 10>::pop_back() [T = wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::Task, N = 10]"
                       );
        }
        builder.
        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
        super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep =
             (Expression **)
             ((long)builder.
                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                    .super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                    replacep + -1);
      }
      else {
        builder.
        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
        super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             builder.
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.
             flexible.
             super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_328 = (undefined1  [8])self;
      if ((Expression *)
          (((CFGBuilder *)self)->
          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          ).super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
          super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.replacep ==
          (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>>::walk(Expression *&) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>]"
                     );
      }
      (*pTVar20->func)((CFGBuilder *)auStack_328,(Expression **)self);
      currp = extraout_RDX_00;
    } while (((long)builder.
                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                    .super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                    stack.flexible.
                    super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)builder.
                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>
                    .super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                    stack.fixed._M_elems[9].currp >> 4) +
             (long)builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                   super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
                   replacep != 0);
  }
  if (builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .loopTops.
      super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::doEndReturn((CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   *)auStack_328,(CFGBuilder *)self,currp);
  }
  if ((char)builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage == '\x01') {
    auStack_78 = (undefined1  [8])
                 builder.
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 .entry;
    std::
    vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
    ::push_back((vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
                 *)&builder.
                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    .exit,(value_type *)auStack_78);
    std::
    unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
    ::~unique_ptr((unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
                   *)auStack_78);
  }
  puVar10 = builder.
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar9 = builder.
           super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
           .exit;
  if (builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    __assert_fail("branches.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x255,
                  "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                 );
  }
  if (builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .ifLastBlockStack.
      super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)builder.
               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
               .branches._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("ifLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x256,
                  "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                 );
  }
  if (builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .loopLastBlockStack.
      super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .ifLastBlockStack.
      super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("loopLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,599,
                  "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                 );
  }
  if (builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .tryLastBlockStack.
      super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .loopLastBlockStack.
      super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("tryLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,600,
                  "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                 );
  }
  if (builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .throwingInstsStack.
      super__Vector_base<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)builder.
               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
               .tryLastBlockStack.
               super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("throwingInstsStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x259,
                  "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                 );
  }
  if ((pointer)builder.
               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
               .tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
      builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .throwingInstsStack.
      super__Vector_base<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("tryStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25a,
                  "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                 );
  }
  if (builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .processCatchStack.
      super__Vector_base<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)builder.
               super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
               .tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("processCatchStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25b,
                  "void wasm::CFGWalker<CFGBuilder, wasm::UnifiedExpressionVisitor<CFGBuilder>, std::vector<wasm::Expression *>>::doWalkFunction(Function *) [SubType = CFGBuilder, VisitorType = wasm::UnifiedExpressionVisitor<CFGBuilder>, Contents = std::vector<wasm::Expression *>]"
                 );
  }
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
  super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task,_std::allocator<wasm::Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n_00 = (long)builder.
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 .basicBlocks.
                 super__Vector_base<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)builder.
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 .exit >> 3;
  local_98.
  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::vector
            ((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
             auStack_d8,__n_00,&local_31);
  oldToNewBlocks._M_h._M_bucket_count =
       (size_type)
       local_98.
       super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  oldToNewBlocks._M_h._M_buckets =
       (__buckets_ptr)
       local_98.
       super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  auStack_78 = (undefined1  [8])
               local_98.
               super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_d8;
  local_98.
  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
  _M_impl.super__Vector_impl_data._M_finish = ___alloc;
  local_98.
  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
  auStack_d8 = (undefined1  [8])0x0;
  ___alloc = (pointer)0x0;
  std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::~vector
            ((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
             auStack_78);
  std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::~vector
            ((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
             auStack_d8);
  auStack_78 = (undefined1  [8])&oldToNewBlocks._M_h._M_rehash_policy._M_next_resize;
  oldToNewBlocks._M_h._M_buckets = (__buckets_ptr)0x1;
  oldToNewBlocks._M_h._M_bucket_count = 0;
  oldToNewBlocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  oldToNewBlocks._M_h._M_element_count._0_4_ = 0x3f800000;
  oldToNewBlocks._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  oldToNewBlocks._M_h._M_rehash_policy._4_4_ = 0;
  oldToNewBlocks._M_h._M_rehash_policy._M_next_resize = 0;
  if ((BasicBlock *)puVar10 != pBVar9) {
    lVar23 = 0;
    do {
      pBVar11 = local_98.
                super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar23;
      p_Var3 = (_Hash_node_base *)
               (&((builder.
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  .exit)->contents).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start)[lVar23];
      uVar18 = (ulong)p_Var3 % (ulong)oldToNewBlocks._M_h._M_buckets;
      p_Var13 = (_Hash_node_base *)
                (&(((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78)->
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                  _M_impl.super__Vector_impl_data._M_start)[uVar18];
      p_Var12 = (_Hash_node_base *)0x0;
      if ((p_Var13 != (_Hash_node_base *)0x0) &&
         (p_Var12 = p_Var13, p_Var21 = p_Var13->_M_nxt, p_Var3 != p_Var13->_M_nxt[1]._M_nxt)) {
        while (p_Var13 = p_Var21->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
          p_Var12 = (_Hash_node_base *)0x0;
          if (((ulong)p_Var13[1]._M_nxt % (ulong)oldToNewBlocks._M_h._M_buckets != uVar18) ||
             (p_Var12 = p_Var21, p_Var21 = p_Var13, p_Var3 == p_Var13[1]._M_nxt)) goto LAB_00cf1ab4;
        }
        p_Var12 = (_Hash_node_base *)0x0;
      }
LAB_00cf1ab4:
      if (p_Var12 == (_Hash_node_base *)0x0) {
        p_Var13 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var13 = p_Var12->_M_nxt;
      }
      if (p_Var13 == (_Hash_node_base *)0x0) {
        p_Var13 = (_Hash_node_base *)operator_new(0x18);
        p_Var13->_M_nxt = (_Hash_node_base *)0x0;
        p_Var13[1]._M_nxt = p_Var3;
        p_Var13[2]._M_nxt = (_Hash_node_base *)0x0;
        auVar24 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)&oldToNewBlocks._M_h._M_element_count,
                             (ulong)oldToNewBlocks._M_h._M_buckets,
                             (ulong)oldToNewBlocks._M_h._M_before_begin._M_nxt);
        __n = auVar24._8_8_;
        if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (__n == (__buckets_ptr)0x1) {
            oldToNewBlocks._M_h._M_rehash_policy._M_next_resize = 0;
            pBVar14 = (BasicBlock *)&oldToNewBlocks._M_h._M_rehash_policy._M_next_resize;
          }
          else {
            pBVar14 = (BasicBlock *)
                      __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                ((new_allocator<std::__detail::_Hash_node_base_*> *)auStack_d8,
                                 (size_type)__n,(void *)0x0);
            memset(pBVar14,0,(long)__n * 8);
          }
          _Var17._M_nxt = (_Hash_node_base *)oldToNewBlocks._M_h._M_bucket_count;
          oldToNewBlocks._M_h._M_bucket_count = 0;
          if (_Var17._M_nxt != (_Hash_node_base *)0x0) {
            uVar18 = 0;
            do {
              p_Var12 = (_Var17._M_nxt)->_M_nxt;
              uVar19 = (ulong)_Var17._M_nxt[1]._M_nxt % (ulong)__n;
              p_Var21 = (_Hash_node_base *)
                        (&(pBVar14->contents).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)[uVar19];
              if (p_Var21 == (_Hash_node_base *)0x0) {
                (_Var17._M_nxt)->_M_nxt = (_Hash_node_base *)oldToNewBlocks._M_h._M_bucket_count;
                oldToNewBlocks._M_h._M_bucket_count = (size_type)_Var17._M_nxt;
                (&(pBVar14->contents).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)[uVar19] =
                     (pointer)&oldToNewBlocks._M_h._M_bucket_count;
                if ((_Var17._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                  pppEVar15 = &(pBVar14->contents).
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar18;
                  goto LAB_00cf1b9a;
                }
              }
              else {
                (_Var17._M_nxt)->_M_nxt = p_Var21->_M_nxt;
                pppEVar15 = (pointer *)
                            (&(pBVar14->contents).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start)[uVar19];
                uVar19 = uVar18;
LAB_00cf1b9a:
                *pppEVar15 = (pointer)_Var17._M_nxt;
              }
              _Var17._M_nxt = p_Var12;
              uVar18 = uVar19;
            } while (p_Var12 != (_Hash_node_base *)0x0);
          }
          if ((undefined1  [8])&oldToNewBlocks._M_h._M_rehash_policy._M_next_resize != auStack_78) {
            operator_delete((void *)auStack_78,(long)oldToNewBlocks._M_h._M_buckets << 3);
          }
          uVar18 = (ulong)p_Var3 % (ulong)__n;
          auStack_78 = (undefined1  [8])pBVar14;
          oldToNewBlocks._M_h._M_buckets = __n;
        }
        p_Var3 = (_Hash_node_base *)
                 (&(((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78)
                   ->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                   _M_impl.super__Vector_impl_data._M_start)[uVar18];
        if (p_Var3 == (_Hash_node_base *)0x0) {
          p_Var13->_M_nxt = (_Hash_node_base *)oldToNewBlocks._M_h._M_bucket_count;
          if (oldToNewBlocks._M_h._M_bucket_count != 0) {
            (&(((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78)->
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
              super__Vector_impl_data._M_start)
            [*(ulong *)(oldToNewBlocks._M_h._M_bucket_count + 8) %
             (ulong)oldToNewBlocks._M_h._M_buckets] = (pointer)p_Var13;
          }
          (&(((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78)->
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
            super__Vector_impl_data._M_start)[uVar18] =
               (pointer)&oldToNewBlocks._M_h._M_bucket_count;
          oldToNewBlocks._M_h._M_bucket_count = (size_type)p_Var13;
        }
        else {
          p_Var13->_M_nxt = p_Var3->_M_nxt;
          ((_Hash_node_base *)
          (&(((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78)->
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
            super__Vector_impl_data._M_start)[uVar18])->_M_nxt = p_Var13;
        }
        oldToNewBlocks._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)((long)&(oldToNewBlocks._M_h._M_before_begin._M_nxt)->_M_nxt + 1);
      }
      p_Var13[2]._M_nxt = (_Hash_node_base *)pBVar11;
      lVar23 = lVar23 + 1;
    } while (lVar23 != __n_00 + (__n_00 == 0));
  }
  if ((BasicBlock *)puVar10 != pBVar9) {
    lVar23 = 0;
    do {
      pBVar11 = local_98.
                super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 = (&((builder.
                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                   .exit)->contents).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar23];
      local_98.
      super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar23].index = (Index)lVar23;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::_M_move_assign
                (&local_98.
                  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar23].insts,ppEVar4);
      std::
      vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
      ::reserve(&pBVar11[lVar23].predecessors,(long)ppEVar4[7] - (long)ppEVar4[6] >> 3);
      pEVar5 = ppEVar4[7];
      for (pEVar22 = ppEVar4[6]; pEVar22 != pEVar5; pEVar22 = (Expression *)&pEVar22->type) {
        auStack_d8 = pEVar22->_id;
        ppBVar16 = std::
                   unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                   ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                         *)auStack_78,(key_type *)auStack_d8);
        iVar6._M_current =
             pBVar11[lVar23].predecessors.
             super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            pBVar11[lVar23].predecessors.
            super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wasm::analysis::BasicBlock_const*,std::allocator<wasm::analysis::BasicBlock_const*>>
          ::_M_realloc_insert<wasm::analysis::BasicBlock_const*const&>
                    ((vector<wasm::analysis::BasicBlock_const*,std::allocator<wasm::analysis::BasicBlock_const*>>
                      *)&pBVar11[lVar23].predecessors,iVar6,ppBVar16);
        }
        else {
          *iVar6._M_current = *ppBVar16;
          pppBVar1 = &pBVar11[lVar23].predecessors.
                      super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
      }
      std::
      vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
      ::reserve(&pBVar11[lVar23].successors,(long)ppEVar4[4] - (long)ppEVar4[3] >> 3);
      pEVar5 = ppEVar4[4];
      for (pEVar22 = ppEVar4[3]; pEVar22 != pEVar5; pEVar22 = (Expression *)&pEVar22->type) {
        auStack_d8 = pEVar22->_id;
        ppBVar16 = std::
                   unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                   ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                         *)auStack_78,(key_type *)auStack_d8);
        iVar6._M_current =
             pBVar11[lVar23].successors.
             super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            pBVar11[lVar23].successors.
            super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wasm::analysis::BasicBlock_const*,std::allocator<wasm::analysis::BasicBlock_const*>>
          ::_M_realloc_insert<wasm::analysis::BasicBlock_const*const&>
                    ((vector<wasm::analysis::BasicBlock_const*,std::allocator<wasm::analysis::BasicBlock_const*>>
                      *)&pBVar11[lVar23].successors,iVar6,ppBVar16);
        }
        else {
          *iVar6._M_current = *ppBVar16;
          pppBVar1 = &pBVar11[lVar23].successors.
                      super__Vector_base<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != __n_00 + (__n_00 == 0));
  }
  if (local_98.
      super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (local_98.
     super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
     _M_impl.super__Vector_impl_data._M_start)->entry = true;
    if (builder.
        super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        .entry != (BasicBlock *)0x0) {
      ppBVar16 = std::
                 unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                 ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                       *)auStack_78,
                      &builder.
                       super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                       .entry);
      (*ppBVar16)->exit = true;
    }
    (__return_storage_ptr__->blocks).
    super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_98.
         super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->blocks).
    super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_98.
         super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->blocks).
    super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.
         super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar8 = (undefined8 *)oldToNewBlocks._M_h._M_bucket_count;
    while (puVar8 != (undefined8 *)0x0) {
      puVar7 = (undefined8 *)*puVar8;
      operator_delete(puVar8,0x18);
      puVar8 = puVar7;
    }
    memset((void *)auStack_78,0,(long)oldToNewBlocks._M_h._M_buckets << 3);
    oldToNewBlocks._M_h._M_bucket_count = 0;
    oldToNewBlocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((undefined1  [8])&oldToNewBlocks._M_h._M_rehash_policy._M_next_resize != auStack_78) {
      operator_delete((void *)auStack_78,(long)oldToNewBlocks._M_h._M_buckets << 3);
    }
    std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::~vector
              (&local_98);
    CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::~CFGWalker((CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  *)auStack_328);
    return __return_storage_ptr__;
  }
  __assert_fail("!cfg.blocks.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/cfg.cpp"
                ,0x41,"static CFG wasm::analysis::CFG::fromFunction(Function *)");
}

Assistant:

CFG CFG::fromFunction(Function* func) {
  struct CFGBuilder : CFGWalker<CFGBuilder,
                                UnifiedExpressionVisitor<CFGBuilder>,
                                std::vector<Expression*>> {
    void visitExpression(Expression* curr) {
      if (currBasicBlock) {
        currBasicBlock->contents.push_back(curr);
      }
    }
  };

  CFGBuilder builder;
  builder.walkFunction(func);

  size_t numBlocks = builder.basicBlocks.size();

  CFG cfg;
  cfg.blocks = std::vector<BasicBlock>(numBlocks);

  // From here the addresses of the new basic blocks are stable.
  std::unordered_map<CFGBuilder::BasicBlock*, BasicBlock*> oldToNewBlocks;
  for (size_t i = 0; i < numBlocks; ++i) {
    oldToNewBlocks[builder.basicBlocks[i].get()] = &cfg.blocks[i];
  }

  for (size_t i = 0; i < numBlocks; ++i) {
    auto& oldBlock = *builder.basicBlocks[i];
    auto& newBlock = cfg.blocks[i];
    newBlock.index = i;
    newBlock.insts = std::move(oldBlock.contents);
    newBlock.predecessors.reserve(oldBlock.in.size());
    for (auto* oldPred : oldBlock.in) {
      newBlock.predecessors.push_back(oldToNewBlocks.at(oldPred));
    }
    newBlock.successors.reserve(oldBlock.out.size());
    for (auto* oldSucc : oldBlock.out) {
      newBlock.successors.push_back(oldToNewBlocks.at(oldSucc));
    }
  }

  assert(!cfg.blocks.empty());
  cfg.blocks[0].entry = true;
  if (builder.exit) {
    oldToNewBlocks.at(builder.exit)->exit = true;
  }

  // Move-construct a new CFG to get mandatory copy elision, preserving basic
  // block addresses through the return.
  return CFG(std::move(cfg));
}